

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDComponentPtr> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chain)

{
  uint uVar1;
  ON_SubDComponentPtr *this;
  ON_SubDEdge *local_48;
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  uint count;
  ON_SimpleArray<ON_SubDEdgePtr> *edge_chain_local;
  ON_SimpleArray<ON_SubDComponentPtr> *edges_local;
  
  a.m_capacity = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount(edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_38,(ulong)(uint)a.m_capacity);
  for (local_3c = 0; local_3c < (uint)a.m_capacity; local_3c = local_3c + 1) {
    this = ON_SimpleArray<ON_SubDComponentPtr>::operator[](edges,local_3c);
    local_48 = ON_SubDComponentPtr::Edge(this);
    ON_SimpleArray<const_ON_SubDEdge_*>::Append
              ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_38,&local_48);
  }
  uVar1 = OrientEdgesIntoEdgeChains((ON_SimpleArray<const_ON_SubDEdge_*> *)local_38,edge_chain);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_38);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDComponentPtr >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chain
)
{
  const unsigned count = edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
    a.Append(edges[i].Edge());
  return ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(a, edge_chain);
}